

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

AppleSDK __thiscall cmMakefile::GetAppleSDKType(cmMakefile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type __n1;
  int iVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  AppleSDK AVar6;
  long *plVar7;
  long lVar8;
  bool bVar9;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string sdkRoot;
  anon_struct_40_2_65dcf250 sdkDatabase [6];
  string local_198;
  long *local_178 [2];
  long local_168 [2];
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  string local_128;
  AppleSDK local_108 [2];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined4 local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined4 local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined4 local_68;
  long *local_60 [2];
  long local_50 [2];
  undefined4 local_40;
  
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CMAKE_OSX_SYSROOT","");
  GetDefinition(this,&local_128);
  std::__cxx11::string::_M_assign((string *)&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::LowerCase(&local_128,&local_198);
  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"appletvos","");
  local_108[0] = AppleTVOS;
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"appletvsimulator","");
  local_e0 = 4;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"iphoneos","");
  local_b8 = 1;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"iphonesimulator","");
  local_90 = 2;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"watchos","");
  local_68 = 5;
  plVar7 = local_50;
  local_60[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"watchsimulator","");
  local_40 = 6;
  lVar8 = 0;
  while( true ) {
    __n1 = *(size_type *)((long)local_108 + lVar8 + -0x18);
    local_138._M_len = local_198._M_string_length;
    local_138._M_str = local_198._M_dataplus._M_p;
    __str._M_str = *(char **)((long)local_108 + lVar8 + -0x20);
    __str._M_len = __n1;
    iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_138,0,__n1,__str);
    if (iVar2 == 0) {
      bVar9 = true;
    }
    else {
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"/","");
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_178,*(ulong *)((long)local_108 + lVar8 + -0x20));
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_148 = *plVar5;
        lStack_140 = plVar3[3];
        local_158 = &local_148;
      }
      else {
        local_148 = *plVar5;
        local_158 = (long *)*plVar3;
      }
      local_150 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      lVar4 = std::__cxx11::string::find((char *)&local_198,(ulong)local_158,0);
      bVar9 = lVar4 != -1;
    }
    if (iVar2 != 0) {
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148 + 1);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
    }
    if (bVar9) break;
    lVar8 = lVar8 + 0x28;
    if (lVar8 == 0xf0) {
      AVar6 = MacOS;
LAB_001b1a73:
      lVar8 = -0xf0;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -5;
        lVar8 = lVar8 + 0x28;
      } while (lVar8 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                 local_198.field_2._M_local_buf[0]) + 1);
      }
      return AVar6;
    }
  }
  AVar6 = *(AppleSDK *)((long)local_108 + lVar8);
  goto LAB_001b1a73;
}

Assistant:

cmMakefile::AppleSDK cmMakefile::GetAppleSDKType() const
{
  std::string sdkRoot;
  sdkRoot = this->GetSafeDefinition("CMAKE_OSX_SYSROOT");
  sdkRoot = cmSystemTools::LowerCase(sdkRoot);

  struct
  {
    std::string name;
    AppleSDK sdk;
  } const sdkDatabase[]{
    { "appletvos", AppleSDK::AppleTVOS },
    { "appletvsimulator", AppleSDK::AppleTVSimulator },
    { "iphoneos", AppleSDK::IPhoneOS },
    { "iphonesimulator", AppleSDK::IPhoneSimulator },
    { "watchos", AppleSDK::WatchOS },
    { "watchsimulator", AppleSDK::WatchSimulator },
  };

  for (auto const& entry : sdkDatabase) {
    if (cmHasPrefix(sdkRoot, entry.name) ||
        sdkRoot.find(std::string("/") + entry.name) != std::string::npos) {
      return entry.sdk;
    }
  }

  return AppleSDK::MacOS;
}